

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::createList(Graph *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  iterator iVar5;
  long lVar6;
  int k;
  int iVar7;
  int iVar8;
  int j;
  ulong uVar9;
  int local_60;
  int local_5c;
  Graph *local_58;
  int (*local_50) [50];
  vector<int,_std::allocator<int>_> *local_48;
  ulong local_40;
  int (*local_38) [50];
  
  uVar3 = this->num_of_vert;
  pvVar1 = this->adj_list;
  lVar6 = 0;
  local_58 = this;
  do {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar6),1);
    lVar4 = *(long *)((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar6);
    if (*(long *)((long)&this->adj_list[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar6) != lVar4) {
      *(long *)((long)&this->adj_list[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + lVar6) = lVar4;
    }
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x4b0);
  if (0 < (int)uVar3) {
    local_50 = local_58->adj_matrix;
    local_40 = 0;
    local_48 = pvVar1;
    do {
      pvVar1 = local_48 + local_40;
      local_38 = local_50 + local_40;
      uVar9 = 0;
      do {
        piVar2 = *local_38 + uVar9;
        iVar7 = *piVar2;
        if (iVar7 == 1) {
          local_5c = (int)uVar9 + 1;
          iVar5._M_current =
               (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar5,&local_5c);
          }
          else {
            *iVar5._M_current = local_5c;
            (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar5._M_current + 1;
          }
          iVar7 = *piVar2;
        }
        if (1 < iVar7) {
          local_58->multigraph_status = true;
          local_58->adjoint_status = false;
          local_58->line_status = false;
          iVar8 = (int)uVar9 + 1;
          iVar7 = 0;
          do {
            iVar5._M_current =
                 (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            local_60 = iVar8;
            if (iVar5._M_current ==
                (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar5,&local_60)
              ;
            }
            else {
              *iVar5._M_current = iVar8;
              (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 < *piVar2);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar3);
      local_40 = local_40 + 1;
    } while (local_40 != uVar3);
  }
  return;
}

Assistant:

void Graph::createList(){
   int nv = this->num_of_vert;
   this->clearList();
   for(int i = 0; i < nv; i++)
      for(int j = 0; j < nv; j++){
         if(this->adj_matrix[i][j] == 1){
            // pushes index of current column + 1 (current vertex)
            this->adj_list[i].push_back(j + 1);
         }
         // if value is bigger than 1, then G is a multigraph
         if(this->adj_matrix[i][j] > 1){
            this->multigraph_status = true;
            this->adjoint_status = false;
            this->line_status = false;
            for(int k = 0; k < this->adj_matrix[i][j]; k++){
               this->adj_list[i].push_back(j + 1);
            }
         }
      }
   return void();
}